

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

void htmlDocDumpMemoryFormat(xmlDocPtr cur,xmlChar **mem,int *size,int format)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf;
  size_t sVar3;
  xmlBufPtr buf_00;
  xmlBufPtr *ppxVar4;
  
  xmlInitParser();
  if (size != (int *)0x0 && mem != (xmlChar **)0x0) {
    *mem = (xmlChar *)0x0;
    *size = 0;
    if (cur != (xmlDocPtr)0x0) {
      pxVar2 = htmlGetMetaEncoding(cur);
      encoder = htmlFindOutputEncoder((char *)pxVar2);
      buf = xmlAllocOutputBuffer(encoder);
      if (buf != (xmlOutputBufferPtr)0x0) {
        xVar1 = cur->type;
        cur->type = XML_HTML_DOCUMENT_NODE;
        htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,(char *)0x0,format);
        cur->type = xVar1;
        xmlOutputBufferFlush(buf);
        if (buf->error == 0) {
          buf_00 = buf->conv;
          if (buf_00 == (xmlBufPtr)0x0) {
            ppxVar4 = &buf->buffer;
            buf_00 = buf->buffer;
          }
          else {
            ppxVar4 = &buf->conv;
          }
          sVar3 = xmlBufUse(buf_00);
          *size = (int)sVar3;
          pxVar2 = xmlBufContent(*ppxVar4);
          pxVar2 = xmlStrndup(pxVar2,*size);
          *mem = pxVar2;
        }
        xmlOutputBufferClose(buf);
        return;
      }
    }
  }
  return;
}

Assistant:

void
htmlDocDumpMemoryFormat(xmlDocPtr cur, xmlChar**mem, int *size, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;

    xmlInitParser();

    if ((mem == NULL) || (size == NULL))
        return;
    *mem = NULL;
    *size = 0;
    if (cur == NULL)
	return;

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlAllocOutputBuffer(handler);
    if (buf == NULL)
	return;

    htmlDocContentDumpFormatOutput(buf, cur, NULL, format);

    xmlOutputBufferFlush(buf);

    if (!buf->error) {
        if (buf->conv != NULL) {
            *size = xmlBufUse(buf->conv);
            *mem = xmlStrndup(xmlBufContent(buf->conv), *size);
        } else {
            *size = xmlBufUse(buf->buffer);
            *mem = xmlStrndup(xmlBufContent(buf->buffer), *size);
        }
    }

    xmlOutputBufferClose(buf);
}